

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.cpp
# Opt level: O3

void __thiscall
chrono::ChLoadBodyInertia::LoadIntLoadResidual_Mv
          (ChLoadBodyInertia *this,ChVectorDynamic<> *R,ChVectorDynamic<> *w,double c)

{
  long *plVar1;
  ulong *puVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  element_type *peVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  undefined1 auVar24 [16];
  int iVar25;
  uint uVar26;
  double *pdVar27;
  ulong uVar28;
  ulong uVar29;
  char *__function;
  uint uVar30;
  ulong uVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  ChVector<double> a_x;
  ChVector<double> v;
  ChVector<double> a_w;
  ChVector<double> local_98;
  double *local_78;
  double adStack_70 [2];
  ChVectorDynamic<> *pCStack_60;
  ulong uStack_58;
  long lStack_50;
  long lStack_48;
  long lStack_40;
  ChVector<double> local_38;
  
  if ((this->super_ChLoadCustom).super_ChLoadBase.jacobians == (ChLoadJacobians *)0x0) {
    return;
  }
  peVar9 = (this->super_ChLoadCustom).loadable.
           super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar25 = (*peVar9->_vptr_ChLoadable[0xb])(peVar9,0);
  if ((char)iVar25 == '\0') {
    return;
  }
  peVar9 = (this->super_ChLoadCustom).loadable.
           super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar26 = (*peVar9->_vptr_ChLoadable[9])(peVar9,0);
  uStack_58 = (ulong)uVar26;
  local_78 = (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
             uStack_58;
  lStack_48 = (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  adStack_70[0] = 1.48219693752374e-323;
  if ((long)uStack_58 <= lStack_48 + -3) {
    pCStack_60 = w;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_98,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)&local_78,(type *)0x0);
    peVar9 = (this->super_ChLoadCustom).loadable.
             super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar25 = (*peVar9->_vptr_ChLoadable[9])(peVar9,0);
    uStack_58 = (ulong)(iVar25 + 3);
    lStack_48 = (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
    ;
    local_78 = (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + uStack_58;
    adStack_70[0] = 1.48219693752374e-323;
    if ((long)uStack_58 <= lStack_48 + -3) {
      pCStack_60 = w;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_38,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_78,(type *)0x0);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = local_38.m_data[0];
      auVar45._8_8_ = local_38.m_data[2];
      auVar45._0_8_ = local_38.m_data[2];
      dVar3 = (this->c_m).m_data[0];
      auVar38._8_8_ = 0;
      auVar38._0_8_ = dVar3;
      dVar4 = (this->c_m).m_data[2];
      auVar47._8_8_ = dVar4;
      auVar47._0_8_ = dVar4;
      auVar17._8_8_ = local_38.m_data[2];
      auVar17._0_8_ = local_38.m_data[1];
      auVar5 = *(undefined1 (*) [16])((this->c_m).m_data + 1);
      auVar39 = vunpcklpd_avx(auVar45,auVar42);
      auVar38 = vunpcklpd_avx(auVar47,auVar38);
      auVar46._0_8_ = auVar5._0_8_ * auVar39._0_8_;
      auVar46._8_8_ = auVar5._8_8_ * auVar39._8_8_;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = dVar3 * local_38.m_data[1];
      auVar39 = vfmsub231sd_fma(auVar39,auVar42,auVar5);
      auVar5 = vfmsub213pd_fma(auVar38,auVar17,auVar46);
      adStack_70[0] = this->mass;
      adStack_70[1] = adStack_70[0] * (auVar39._0_8_ + local_98.m_data[2]);
      local_78 = (double *)(adStack_70[0] * (auVar5._0_8_ + local_98.m_data[0]));
      adStack_70[0] = adStack_70[0] * (auVar5._8_8_ + local_98.m_data[1]);
      peVar9 = (this->super_ChLoadCustom).loadable.
               super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar26 = (*peVar9->_vptr_ChLoadable[9])(peVar9,0);
      if ((long)(ulong)uVar26 <=
          (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3)
      {
        pdVar27 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data + uVar26;
        uVar28 = 3;
        if (((ulong)pdVar27 & 7) == 0) {
          uVar26 = -((uint)((ulong)pdVar27 >> 3) & 0x1fffffff) & 7;
          uVar31 = (ulong)uVar26;
          if (uVar31 < 3) {
            uVar28 = uVar31;
          }
          if (uVar26 != 0) goto LAB_005c9fab;
        }
        else {
LAB_005c9fab:
          uVar31 = uVar28 - 1;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = c;
          auVar33 = vbroadcastsd_avx512f(auVar5);
          auVar34 = vpbroadcastq_avx512f();
          uVar29 = vpcmpuq_avx512f(auVar34,_DAT_00969a00,5);
          bVar10 = (byte)uVar29;
          auVar34._8_8_ = (ulong)((byte)(uVar29 >> 1) & 1) * (long)adStack_70[0];
          auVar34._0_8_ = (ulong)(bVar10 & 1) * (long)local_78;
          auVar34._16_8_ = (ulong)((byte)(uVar29 >> 2) & 1) * (long)adStack_70[1];
          auVar34._24_8_ = (ulong)((byte)(uVar29 >> 3) & 1) * (long)pCStack_60;
          auVar34._32_8_ = ((byte)(uVar29 >> 4) & 1) * uStack_58;
          auVar34._40_8_ = (ulong)((byte)(uVar29 >> 5) & 1) * lStack_50;
          auVar34._48_8_ = (ulong)((byte)(uVar29 >> 6) & 1) * lStack_48;
          auVar34._56_8_ = (uVar29 >> 7) * lStack_40;
          auVar35._8_8_ = (ulong)((byte)(uVar29 >> 1) & 1) * (long)pdVar27[1];
          auVar35._0_8_ = (ulong)(bVar10 & 1) * (long)*pdVar27;
          auVar35._16_8_ = (ulong)((byte)(uVar29 >> 2) & 1) * (long)pdVar27[2];
          auVar35._24_8_ = (ulong)((byte)(uVar29 >> 3) & 1) * (long)pdVar27[3];
          auVar35._32_8_ = (ulong)((byte)(uVar29 >> 4) & 1) * (long)pdVar27[4];
          auVar35._40_8_ = (ulong)((byte)(uVar29 >> 5) & 1) * (long)pdVar27[5];
          auVar35._48_8_ = (ulong)((byte)(uVar29 >> 6) & 1) * (long)pdVar27[6];
          auVar35._56_8_ = (uVar29 >> 7) * (long)pdVar27[7];
          auVar33 = vmulpd_avx512f(auVar34,auVar33);
          auVar33 = vaddpd_avx512f(auVar33,auVar35);
          bVar11 = (bool)((byte)(uVar29 >> 1) & 1);
          bVar12 = (bool)((byte)(uVar29 >> 2) & 1);
          bVar13 = (bool)((byte)(uVar29 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar29 >> 4) & 1);
          bVar15 = (bool)((byte)(uVar29 >> 5) & 1);
          bVar16 = (bool)((byte)(uVar29 >> 6) & 1);
          *pdVar27 = (double)((ulong)(bVar10 & 1) * auVar33._0_8_ |
                             (ulong)!(bool)(bVar10 & 1) * (long)*pdVar27);
          pdVar27[1] = (double)((ulong)bVar11 * auVar33._8_8_ | (ulong)!bVar11 * (long)pdVar27[1]);
          pdVar27[2] = (double)((ulong)bVar12 * auVar33._16_8_ | (ulong)!bVar12 * (long)pdVar27[2]);
          pdVar27[3] = (double)((ulong)bVar13 * auVar33._24_8_ | (ulong)!bVar13 * (long)pdVar27[3]);
          pdVar27[4] = (double)((ulong)bVar14 * auVar33._32_8_ | (ulong)!bVar14 * (long)pdVar27[4]);
          pdVar27[5] = (double)((ulong)bVar15 * auVar33._40_8_ | (ulong)!bVar15 * (long)pdVar27[5]);
          pdVar27[6] = (double)((ulong)bVar16 * auVar33._48_8_ | (ulong)!bVar16 * (long)pdVar27[6]);
          pdVar27[7] = (double)((uVar29 >> 7) * auVar33._56_8_ |
                               (ulong)!SUB81(uVar29 >> 7,0) * (long)pdVar27[7]);
        }
        if (uVar28 < 3) {
          uVar31 = 2 - uVar28;
          uVar29 = (ulong)(uint)((int)uVar28 << 3);
          auVar32 = vpbroadcastq_avx512vl();
          uVar28 = vpcmpuq_avx512vl(auVar32,_DAT_00955380,5);
          uVar28 = uVar28 & 0xf;
          lVar18 = *(long *)((long)adStack_70 + uVar29);
          lVar19 = *(long *)((long)adStack_70 + uVar29 + 8);
          lVar20 = *(long *)((long)&pCStack_60 + uVar29);
          bVar10 = (byte)uVar28;
          plVar1 = (long *)((long)pdVar27 + uVar29);
          lVar21 = plVar1[1];
          lVar22 = plVar1[2];
          lVar23 = plVar1[3];
          puVar2 = (ulong *)((long)pdVar27 + uVar29);
          bVar11 = (bool)((byte)(uVar28 >> 1) & 1);
          bVar12 = (bool)((byte)(uVar28 >> 2) & 1);
          *puVar2 = (ulong)(bVar10 & 1) *
                    (long)((double)((ulong)(bVar10 & 1) * *(long *)((long)&local_78 + uVar29)) * c +
                          (double)((ulong)(bVar10 & 1) * *plVar1)) |
                    (ulong)!(bool)(bVar10 & 1) * *puVar2;
          puVar2[1] = (ulong)bVar11 *
                      (long)((double)((ulong)((byte)(uVar28 >> 1) & 1) * lVar18) * c +
                            (double)((ulong)((byte)(uVar28 >> 1) & 1) * lVar21)) |
                      (ulong)!bVar11 * puVar2[1];
          puVar2[2] = (ulong)bVar12 *
                      (long)((double)((ulong)((byte)(uVar28 >> 2) & 1) * lVar19) * c +
                            (double)((ulong)((byte)(uVar28 >> 2) & 1) * lVar22)) |
                      (ulong)!bVar12 * puVar2[2];
          puVar2[3] = (uVar28 >> 3) *
                      (long)((double)((uVar28 >> 3) * lVar20) * c + (double)((uVar28 >> 3) * lVar23)
                            ) | (ulong)!SUB81(uVar28 >> 3,0) * puVar2[3];
        }
        auVar40._8_8_ = 0;
        auVar40._0_8_ = local_98.m_data[0];
        auVar53._8_8_ = local_98.m_data[2];
        auVar53._0_8_ = local_98.m_data[2];
        auVar5 = *(undefined1 (*) [16])((this->c_m).m_data + 1);
        auVar43._8_8_ = 0;
        auVar43._0_8_ = (this->c_m).m_data[0];
        dVar3 = (this->c_m).m_data[2];
        auVar51._8_8_ = dVar3;
        auVar51._0_8_ = dVar3;
        auVar24._8_8_ = local_98.m_data[2];
        auVar24._0_8_ = local_98.m_data[1];
        auVar49._8_8_ = local_38.m_data[0];
        auVar49._0_8_ = local_38.m_data[0];
        auVar50._8_8_ = local_38.m_data[2];
        auVar50._0_8_ = local_38.m_data[2];
        auVar39 = vmovhpd_avx(*(undefined1 (*) [16])
                               (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array,
                              (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array[3]);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[6];
        auVar48._8_8_ = 0;
        auVar48._0_8_ =
             local_38.m_data[1] *
             (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
        auVar42 = vfmadd231sd_fma(auVar48,auVar49,auVar6);
        auVar38 = vunpcklpd_avx(auVar53,auVar40);
        auVar17 = vunpcklpd_avx(auVar51,auVar43);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[8];
        auVar42 = vfmadd231sd_fma(auVar42,auVar50,auVar7);
        auVar52._0_8_ = local_98.m_data[1] * auVar17._0_8_;
        auVar52._8_8_ = local_98.m_data[2] * auVar17._8_8_;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = auVar5._0_8_ * local_98.m_data[0];
        auVar17 = vfmsub231sd_fma(auVar41,auVar43,auVar24);
        dVar3 = this->mass;
        auVar38 = vfmsub213pd_fma(auVar38,auVar5,auVar52);
        auVar5 = vmovhpd_avx(*(undefined1 (*) [16])
                              ((this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + 1),
                             (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[4]);
        adStack_70[1] = dVar3 * auVar17._0_8_ + auVar42._0_8_;
        auVar44._0_8_ = local_38.m_data[1] * auVar5._0_8_;
        auVar44._8_8_ = local_38.m_data[1] * auVar5._8_8_;
        auVar39 = vfmadd213pd_fma(auVar39,auVar49,auVar44);
        auVar5 = vmovhpd_avx(*(undefined1 (*) [16])
                              ((this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + 2),
                             (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[5]);
        auVar5 = vfmadd213pd_fma(auVar5,auVar50,auVar39);
        local_78 = (double *)(auVar38._0_8_ * dVar3 + auVar5._0_8_);
        adStack_70[0] = auVar38._8_8_ * dVar3 + auVar5._8_8_;
        peVar9 = (this->super_ChLoadCustom).loadable.
                 super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        iVar25 = (*peVar9->_vptr_ChLoadable[9])(peVar9,0,uVar31);
        if ((long)(ulong)(iVar25 + 3) <=
            (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows +
            -3) {
          pdVar27 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data + (iVar25 + 3);
          uVar26 = 3;
          if (((ulong)pdVar27 & 7) == 0) {
            uVar30 = -((uint)((ulong)pdVar27 >> 3) & 0x1fffffff) & 7;
            if (uVar30 < 3) {
              uVar26 = uVar30;
            }
            if (uVar30 == 0) goto LAB_005ca190;
          }
          auVar8._8_8_ = 0;
          auVar8._0_8_ = c;
          auVar33 = vbroadcastsd_avx512f(auVar8);
          auVar34 = vpbroadcastq_avx512f();
          uVar28 = vpcmpuq_avx512f(auVar34,_DAT_00969a00,5);
          bVar10 = (byte)uVar28;
          auVar36._8_8_ = (ulong)((byte)(uVar28 >> 1) & 1) * (long)adStack_70[0];
          auVar36._0_8_ = (ulong)(bVar10 & 1) * (long)local_78;
          auVar36._16_8_ = (ulong)((byte)(uVar28 >> 2) & 1) * (long)adStack_70[1];
          auVar36._24_8_ = (ulong)((byte)(uVar28 >> 3) & 1) * (long)pCStack_60;
          auVar36._32_8_ = ((byte)(uVar28 >> 4) & 1) * uStack_58;
          auVar36._40_8_ = (ulong)((byte)(uVar28 >> 5) & 1) * lStack_50;
          auVar36._48_8_ = (ulong)((byte)(uVar28 >> 6) & 1) * lStack_48;
          auVar36._56_8_ = (uVar28 >> 7) * lStack_40;
          auVar37._8_8_ = (ulong)((byte)(uVar28 >> 1) & 1) * (long)pdVar27[1];
          auVar37._0_8_ = (ulong)(bVar10 & 1) * (long)*pdVar27;
          auVar37._16_8_ = (ulong)((byte)(uVar28 >> 2) & 1) * (long)pdVar27[2];
          auVar37._24_8_ = (ulong)((byte)(uVar28 >> 3) & 1) * (long)pdVar27[3];
          auVar37._32_8_ = (ulong)((byte)(uVar28 >> 4) & 1) * (long)pdVar27[4];
          auVar37._40_8_ = (ulong)((byte)(uVar28 >> 5) & 1) * (long)pdVar27[5];
          auVar37._48_8_ = (ulong)((byte)(uVar28 >> 6) & 1) * (long)pdVar27[6];
          auVar37._56_8_ = (uVar28 >> 7) * (long)pdVar27[7];
          auVar33 = vmulpd_avx512f(auVar36,auVar33);
          auVar33 = vaddpd_avx512f(auVar33,auVar37);
          bVar11 = (bool)((byte)(uVar28 >> 1) & 1);
          bVar12 = (bool)((byte)(uVar28 >> 2) & 1);
          bVar13 = (bool)((byte)(uVar28 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar28 >> 4) & 1);
          bVar15 = (bool)((byte)(uVar28 >> 5) & 1);
          bVar16 = (bool)((byte)(uVar28 >> 6) & 1);
          *pdVar27 = (double)((ulong)(bVar10 & 1) * auVar33._0_8_ |
                             (ulong)!(bool)(bVar10 & 1) * (long)*pdVar27);
          pdVar27[1] = (double)((ulong)bVar11 * auVar33._8_8_ | (ulong)!bVar11 * (long)pdVar27[1]);
          pdVar27[2] = (double)((ulong)bVar12 * auVar33._16_8_ | (ulong)!bVar12 * (long)pdVar27[2]);
          pdVar27[3] = (double)((ulong)bVar13 * auVar33._24_8_ | (ulong)!bVar13 * (long)pdVar27[3]);
          pdVar27[4] = (double)((ulong)bVar14 * auVar33._32_8_ | (ulong)!bVar14 * (long)pdVar27[4]);
          pdVar27[5] = (double)((ulong)bVar15 * auVar33._40_8_ | (ulong)!bVar15 * (long)pdVar27[5]);
          pdVar27[6] = (double)((ulong)bVar16 * auVar33._48_8_ | (ulong)!bVar16 * (long)pdVar27[6]);
          pdVar27[7] = (double)((uVar28 >> 7) * auVar33._56_8_ |
                               (ulong)!SUB81(uVar28 >> 7,0) * (long)pdVar27[7]);
LAB_005ca190:
          if (uVar26 < 3) {
            uVar31 = (ulong)(uVar26 << 3);
            auVar32 = vpbroadcastq_avx512vl();
            uVar28 = vpcmpuq_avx512vl(auVar32,_DAT_00955380,5);
            uVar28 = uVar28 & 0xf;
            lVar18 = *(long *)((long)adStack_70 + uVar31);
            lVar19 = *(long *)((long)adStack_70 + uVar31 + 8);
            lVar20 = *(long *)((long)&pCStack_60 + uVar31);
            bVar10 = (byte)uVar28;
            plVar1 = (long *)((long)pdVar27 + uVar31);
            lVar21 = plVar1[1];
            lVar22 = plVar1[2];
            lVar23 = plVar1[3];
            puVar2 = (ulong *)((long)pdVar27 + uVar31);
            bVar11 = (bool)((byte)(uVar28 >> 1) & 1);
            bVar12 = (bool)((byte)(uVar28 >> 2) & 1);
            *puVar2 = (ulong)(bVar10 & 1) *
                      (long)((double)((ulong)(bVar10 & 1) * *(long *)((long)&local_78 + uVar31)) * c
                            + (double)((ulong)(bVar10 & 1) * *plVar1)) |
                      (ulong)!(bool)(bVar10 & 1) * *puVar2;
            puVar2[1] = (ulong)bVar11 *
                        (long)((double)((ulong)((byte)(uVar28 >> 1) & 1) * lVar18) * c +
                              (double)((ulong)((byte)(uVar28 >> 1) & 1) * lVar21)) |
                        (ulong)!bVar11 * puVar2[1];
            puVar2[2] = (ulong)bVar12 *
                        (long)((double)((ulong)((byte)(uVar28 >> 2) & 1) * lVar19) * c +
                              (double)((ulong)((byte)(uVar28 >> 2) & 1) * lVar22)) |
                        (ulong)!bVar12 * puVar2[2];
            puVar2[3] = (uVar28 >> 3) *
                        (long)((double)((uVar28 >> 3) * lVar20) * c +
                              (double)((uVar28 >> 3) * lVar23)) |
                        (ulong)!SUB81(uVar28 >> 3,0) * puVar2[3];
          }
          return;
        }
      }
      __function = 
      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_005ca217;
    }
  }
  adStack_70[0] = 1.48219693752374e-323;
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
  pCStack_60 = w;
LAB_005ca217:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void ChLoadBodyInertia::LoadIntLoadResidual_Mv(ChVectorDynamic<>& R, const ChVectorDynamic<>& w, const double c) {
    if (!this->jacobians)
        return;

    if (!loadable->IsSubBlockActive(0))
        return;

    // fetch w as a contiguous vector
    ChVector<> a_x = w.segment(loadable->GetSubBlockOffset(0), 3);
    ChVector<> a_w = w.segment(loadable->GetSubBlockOffset(0)+3, 3);

    // R+=c*M*a  
    R.segment(loadable->GetSubBlockOffset(0), 3)   += c * (this->mass * (a_x + chrono::Vcross(a_w, this->c_m))).eigen();
    R.segment(loadable->GetSubBlockOffset(0)+3, 3) += c * (this->mass * chrono::Vcross(this->c_m, a_x) + this->I * a_w).eigen();
}